

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

bool ON_CRT_LOCALE::Validate_sscanf_s(void)

{
  bool bVar1;
  int scan_rc;
  double dStack_10;
  int scanf_rc;
  double a;
  
  dStack_10 = -1.23432101234321e+308;
  scan_rc = __isoc99_sscanf(m_validation_string,m_validation_scan_format,&stack0xfffffffffffffff0);
  bVar1 = ValidateDouble(dStack_10,scan_rc);
  return bVar1;
}

Assistant:

static bool Validate_sscanf_s()
  {
#if defined(ON_COMPILER_CLANG) || defined(ON_COMPILER_GNU)
    // Test formatted scanning
    double a = ON_UNSET_VALUE;
    // Testing C-runtime - do not using ON_String::Scan
    int scanf_rc = sscanf(m_validation_string, m_validation_scan_format, &a);
    return ValidateDouble(a, scanf_rc);
#else
    // Test formatted scanning
    double a = ON_UNSET_VALUE;
    // Testing C-runtime - do not using ON_String::Scan
    int scanf_rc = sscanf_s(m_validation_string, m_validation_scan_format, &a);
    return ValidateDouble(a, scanf_rc);
#endif
  }